

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O3

string * __thiscall
Kraken::KClient::signature
          (string *__return_storage_ptr__,KClient *this,string *path,string *nonce,string *postdata)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  long lVar1;
  long lVar2;
  void *key;
  int iVar3;
  uchar *md;
  BIO_METHOD *pBVar4;
  BIO *pBVar5;
  BIO *pBVar6;
  uchar *md_00;
  HMAC_CTX *ctx;
  EVP_MD *md_01;
  runtime_error *this_00;
  value_type_conflict1 *__val;
  value_type_conflict1 *__val_1;
  uint len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  uchar *local_b8;
  long local_b0;
  void *local_a0;
  uint local_98;
  
  __first._M_current = (path->_M_dataplus)._M_p;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + path->_M_string_length),(allocator_type *)&local_a0);
  std::operator+(&local_d8,nonce,postdata);
  md = (uchar *)operator_new(0x20);
  md[0x10] = '\0';
  md[0x11] = '\0';
  md[0x12] = '\0';
  md[0x13] = '\0';
  md[0x14] = '\0';
  md[0x15] = '\0';
  md[0x16] = '\0';
  md[0x17] = '\0';
  md[0x18] = '\0';
  md[0x19] = '\0';
  md[0x1a] = '\0';
  md[0x1b] = '\0';
  md[0x1c] = '\0';
  md[0x1d] = '\0';
  md[0x1e] = '\0';
  md[0x1f] = '\0';
  md[0] = '\0';
  md[1] = '\0';
  md[2] = '\0';
  md[3] = '\0';
  md[4] = '\0';
  md[5] = '\0';
  md[6] = '\0';
  md[7] = '\0';
  md[8] = '\0';
  md[9] = '\0';
  md[10] = '\0';
  md[0xb] = '\0';
  md[0xc] = '\0';
  md[0xd] = '\0';
  md[0xe] = '\0';
  md[0xf] = '\0';
  SHA256_Init((SHA256_CTX *)&local_a0);
  SHA256_Update((SHA256_CTX *)&local_a0,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  SHA256_Final(md,(SHA256_CTX *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,local_b0,md,md + 0x20)
  ;
  pBVar4 = BIO_f_base64();
  pBVar5 = BIO_new(pBVar4);
  BIO_set_flags(pBVar5,0x100);
  pBVar6 = BIO_new_mem_buf((this->secret_)._M_dataplus._M_p,(int)(this->secret_)._M_string_length);
  pBVar5 = BIO_push(pBVar5,pBVar6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
             (this->secret_)._M_string_length,(allocator_type *)&local_d8);
  iVar3 = BIO_read(pBVar5,local_a0,local_98 - (int)local_a0);
  BIO_free_all(pBVar5);
  if (-1 < iVar3) {
    local_d8._M_dataplus._M_p._0_4_ = 0x40;
    md_00 = (uchar *)operator_new(0x40);
    md_00[0x30] = '\0';
    md_00[0x31] = '\0';
    md_00[0x32] = '\0';
    md_00[0x33] = '\0';
    md_00[0x34] = '\0';
    md_00[0x35] = '\0';
    md_00[0x36] = '\0';
    md_00[0x37] = '\0';
    md_00[0x38] = '\0';
    md_00[0x39] = '\0';
    md_00[0x3a] = '\0';
    md_00[0x3b] = '\0';
    md_00[0x3c] = '\0';
    md_00[0x3d] = '\0';
    md_00[0x3e] = '\0';
    md_00[0x3f] = '\0';
    md_00[0x20] = '\0';
    md_00[0x21] = '\0';
    md_00[0x22] = '\0';
    md_00[0x23] = '\0';
    md_00[0x24] = '\0';
    md_00[0x25] = '\0';
    md_00[0x26] = '\0';
    md_00[0x27] = '\0';
    md_00[0x28] = '\0';
    md_00[0x29] = '\0';
    md_00[0x2a] = '\0';
    md_00[0x2b] = '\0';
    md_00[0x2c] = '\0';
    md_00[0x2d] = '\0';
    md_00[0x2e] = '\0';
    md_00[0x2f] = '\0';
    md_00[0x10] = '\0';
    md_00[0x11] = '\0';
    md_00[0x12] = '\0';
    md_00[0x13] = '\0';
    md_00[0x14] = '\0';
    md_00[0x15] = '\0';
    md_00[0x16] = '\0';
    md_00[0x17] = '\0';
    md_00[0x18] = '\0';
    md_00[0x19] = '\0';
    md_00[0x1a] = '\0';
    md_00[0x1b] = '\0';
    md_00[0x1c] = '\0';
    md_00[0x1d] = '\0';
    md_00[0x1e] = '\0';
    md_00[0x1f] = '\0';
    md_00[0] = '\0';
    md_00[1] = '\0';
    md_00[2] = '\0';
    md_00[3] = '\0';
    md_00[4] = '\0';
    md_00[5] = '\0';
    md_00[6] = '\0';
    md_00[7] = '\0';
    md_00[8] = '\0';
    md_00[9] = '\0';
    md_00[10] = '\0';
    md_00[0xb] = '\0';
    md_00[0xc] = '\0';
    md_00[0xd] = '\0';
    md_00[0xe] = '\0';
    md_00[0xf] = '\0';
    ctx = (HMAC_CTX *)HMAC_CTX_new();
    key = local_a0;
    md_01 = EVP_sha512();
    HMAC_Init_ex(ctx,key,local_98 - (int)key,md_01,(ENGINE *)0x0);
    HMAC_Update(ctx,local_b8,local_b0 - (long)local_b8);
    HMAC_Final(ctx,md_00,(uint *)&local_d8);
    HMAC_CTX_free(ctx);
    pBVar4 = BIO_f_base64();
    pBVar5 = BIO_new(pBVar4);
    BIO_set_flags(pBVar5,0x100);
    pBVar4 = BIO_s_mem();
    pBVar6 = BIO_new(pBVar4);
    pBVar5 = BIO_push(pBVar5,pBVar6);
    BIO_write(pBVar5,md_00,0x40);
    BIO_ctrl(pBVar5,0xb,0,(void *)0x0);
    local_d8._M_dataplus._M_p = (pointer)0x0;
    BIO_ctrl(pBVar5,0x73,0,&local_d8);
    lVar1 = *(long *)(local_d8._M_dataplus._M_p + 8);
    lVar2 = *(long *)local_d8._M_dataplus._M_p;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
    BIO_free_all(pBVar5);
    operator_delete(md_00);
    if ((pointer)local_a0 != (pointer)0x0) {
      operator_delete(local_a0);
    }
    operator_delete(md);
    if (local_b8 != (uchar *)0x0) {
      operator_delete(local_b8);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"failed while decoding base64.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KClient::signature(const std::string& path, 
			    const std::string& nonce, 
			    const std::string& postdata) const
{
   // add path to data to encrypt
   std::vector<unsigned char> data(path.begin(), path.end());

   // concatenate nonce and postdata and compute SHA256
   std::vector<unsigned char> nonce_postdata = sha256(nonce + postdata);

   // concatenate path and nonce_postdata (path + sha256(nonce + postdata))
   data.insert(data.end(), nonce_postdata.begin(), nonce_postdata.end());

   // and compute HMAC
   return b64_encode( hmac_sha512(data, b64_decode(secret_)) );
}